

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.h
# Opt level: O2

void __thiscall CodeGenGenericContext::CodeGenGenericContext(CodeGenGenericContext *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x20;
  do {
    *(undefined4 *)((long)(this->genReg + -1) + lVar2) = 0;
    *(undefined8 *)((long)this->genReg + lVar2 + -8) = 0;
    puVar1 = (undefined8 *)((long)this->genReg + lVar2 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x240);
  lVar2 = 0x298;
  do {
    *(undefined4 *)((long)(this->genReg + -1) + lVar2) = 0;
    *(undefined8 *)((long)this->genReg + lVar2 + -8) = 0;
    puVar1 = (undefined8 *)((long)this->genReg + lVar2 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x498);
  lVar2 = 0x4e0;
  do {
    *(undefined4 *)((long)this->genReg + lVar2 + -0x18) = 0;
    puVar1 = (undefined8 *)((long)&this->genReg[0].ptrBase + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&this->genReg[1].type + lVar2) = 0;
    puVar1 = (undefined8 *)((long)this->genReg + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->genReg + lVar2 + -4);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x960);
  this->x86Op = (x86Instruction *)0x0;
  this->x86Base = (x86Instruction *)0x0;
  this->x86LookBehind = true;
  memset(&this->lastInvalidate,0,0x279);
  memset(this->xmmReg,0,0x720);
  this->lockedRegA = rRegCount;
  this->lockedRegB = rRegCount;
  this->currFreeXmmReg = rXMM0;
  this->lockedXmmRegA = rXmmRegCount;
  this->lockedXmmRegB = rXmmRegCount;
  this->skipTracking = false;
  return;
}

Assistant:

CodeGenGenericContext()
	{
		x86Op = NULL;
		x86Base = NULL;

		x86LookBehind = true;

		lastInvalidate = 0;

		memset(genReg, 0, rRegCount * sizeof(x86Argument));
		memset(genRegUpdate, 0, rRegCount * sizeof(unsigned));
		memset(genRegRead, 0, rRegCount * sizeof(bool));

		memset(xmmReg, 0, rXmmRegCount * sizeof(x86Argument));
		memset(xmmRegUpdate, 0, rXmmRegCount * sizeof(unsigned));
		memset(xmmRegRead, 0, rXmmRegCount * sizeof(bool));

		memset(memCache, 0, memoryStateSize * sizeof(MemCache));

		memCacheNextSlot = 0;
		memCacheFreeSlotCount = 0;

		memset(memCacheFreeSlots, 0, memoryStateSize * sizeof(unsigned));

		optimizationCount = 0;

		currFreeReg = 0;
		lockedRegA = rRegCount;
		lockedRegB = rRegCount;

		currFreeXmmReg = rXMM0;
		lockedXmmRegA = rXmmRegCount;
		lockedXmmRegB = rXmmRegCount;

		skipTracking = false;
	}